

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxWhileLoop::DoResolve(FxWhileLoop *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxBoolCast *this_00;
  undefined4 extraout_var_01;
  FxExpression *pFVar3;
  FCompileContext *size;
  ExpVal local_30;
  
  if ((this->super_FxLoopStatement).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxLoopStatement).super_FxExpression.isresolved = true;
  if (this->Condition != (FxExpression *)0x0) {
    size = ctx;
    iVar2 = (*this->Condition->_vptr_FxExpression[2])();
    pFVar3 = (FxExpression *)CONCAT44(extraout_var,iVar2);
    this->Condition = pFVar3;
    if (pFVar3 != (FxExpression *)0x0) {
      if (this->Code != (FxExpression *)0x0) {
        size = ctx;
        iVar2 = (*this->Code->_vptr_FxExpression[2])();
        this->Code = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
        if ((FxExpression *)CONCAT44(extraout_var_00,iVar2) == (FxExpression *)0x0)
        goto LAB_005190ce;
        pFVar3 = this->Condition;
      }
      if (pFVar3->ValueType != (PType *)TypeBool) {
        this_00 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
        FxBoolCast::FxBoolCast(this_00,this->Condition,true);
        this->Condition = (FxExpression *)this_00;
        iVar2 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
        pFVar3 = (FxExpression *)CONCAT44(extraout_var_01,iVar2);
        this->Condition = pFVar3;
        if (pFVar3 == (FxExpression *)0x0) goto LAB_005190ce;
      }
      iVar2 = (*pFVar3->_vptr_FxExpression[3])(pFVar3);
      if ((char)iVar2 == '\0') {
        return (FxExpression *)this;
      }
      pFVar3 = this->Condition + 1;
      ExpVal::ExpVal(&local_30,(ExpVal *)pFVar3);
      bVar1 = ExpVal::GetBool(&local_30);
      ExpVal::~ExpVal(&local_30);
      if (bVar1) {
        if (this->Code != (FxExpression *)0x0) {
          return (FxExpression *)this;
        }
        FScriptPosition::Message
                  (&(this->super_FxLoopStatement).super_FxExpression.ScriptPosition,0,
                   "Infinite empty loop");
        return (FxExpression *)this;
      }
      pFVar3 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x28,(size_t)pFVar3);
      FxNop::FxNop((FxNop *)pFVar3,&(this->super_FxLoopStatement).super_FxExpression.ScriptPosition)
      ;
      (*(this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression[1])(this);
      return pFVar3;
    }
  }
LAB_005190ce:
  (*(this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxWhileLoop::DoResolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Condition, ctx);
	SAFE_RESOLVE_OPT(Code, ctx);

	if (Condition->ValueType != TypeBool)
	{
		Condition = new FxBoolCast(Condition);
		SAFE_RESOLVE(Condition, ctx);
	}

	if (Condition->isConstant())
	{
		if (static_cast<FxConstant *>(Condition)->GetValue().GetBool() == false)
		{ // Nothing happens
			FxExpression *nop = new FxNop(ScriptPosition);
			delete this;
			return nop;
		}
		else if (Code == nullptr)
		{ // "while (true) { }"
		  // Someone could be using this for testing.
			ScriptPosition.Message(MSG_WARNING, "Infinite empty loop");
		}
	}

	return this;
}